

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_tables.cpp
# Opt level: O0

void TableSettingsHandler_WriteAll
               (ImGuiContext *ctx,ImGuiSettingsHandler *handler,ImGuiTextBuffer *buf)

{
  int iVar1;
  bool bVar2;
  bool bVar3;
  bool bVar4;
  bool bVar5;
  bool bVar6;
  char local_53;
  uint local_44;
  bool save_column;
  ImGuiTableColumnSettings *pIStack_40;
  int column_n;
  ImGuiTableColumnSettings *column;
  bool save_sort;
  bool save_order;
  bool save_visible;
  ImGuiTableSettings *pIStack_30;
  bool save_size;
  ImGuiTableSettings *settings;
  ImGuiContext *g;
  ImGuiTextBuffer *buf_local;
  ImGuiSettingsHandler *handler_local;
  ImGuiContext *ctx_local;
  
  for (pIStack_30 = ImChunkStream<ImGuiTableSettings>::begin(&ctx->SettingsTables);
      pIStack_30 != (ImGuiTableSettings *)0x0;
      pIStack_30 = ImChunkStream<ImGuiTableSettings>::next_chunk(&ctx->SettingsTables,pIStack_30)) {
    if (pIStack_30->ID != 0) {
      bVar2 = (pIStack_30->SaveFlags & 1U) != 0;
      bVar3 = (pIStack_30->SaveFlags & 4U) != 0;
      bVar4 = (pIStack_30->SaveFlags & 2U) != 0;
      bVar5 = (pIStack_30->SaveFlags & 8U) != 0;
      if ((((bVar2) || (bVar3)) || (bVar4)) || (bVar5)) {
        iVar1 = ImGuiTextBuffer::size(buf);
        ImGuiTextBuffer::reserve(buf,iVar1 + 0x1e + pIStack_30->ColumnsCount * 0x32);
        ImGuiTextBuffer::appendf
                  (buf,"[%s][0x%08X,%d]\n",handler->TypeName,(ulong)pIStack_30->ID,
                   (ulong)(uint)(int)pIStack_30->ColumnsCount);
        if ((pIStack_30->RefScale != 0.0) || (NAN(pIStack_30->RefScale))) {
          ImGuiTextBuffer::appendf(buf,"RefScale=%g\n",(double)pIStack_30->RefScale);
        }
        pIStack_40 = ImGuiTableSettings::GetColumnSettings(pIStack_30);
        for (local_44 = 0; (int)local_44 < (int)pIStack_30->ColumnsCount; local_44 = local_44 + 1) {
          bVar6 = true;
          if (((pIStack_40->UserID == 0) && (bVar6 = true, !bVar2)) &&
             ((bVar6 = true, !bVar3 && ((bVar6 = true, !bVar4 && (bVar6 = false, bVar5)))))) {
            bVar6 = pIStack_40->SortOrder != -1;
          }
          if (bVar6) {
            ImGuiTextBuffer::appendf(buf,"Column %-2d",(ulong)local_44);
            if (pIStack_40->UserID != 0) {
              ImGuiTextBuffer::appendf(buf," UserID=%08X",(ulong)pIStack_40->UserID);
            }
            if ((bVar2) && (((byte)pIStack_40->field_0xb >> 3 & 1) != 0)) {
              ImGuiTextBuffer::appendf(buf," Weight=%.4f",(double)pIStack_40->WidthOrWeight);
            }
            if ((bVar2) && (((byte)pIStack_40->field_0xb >> 3 & 1) == 0)) {
              ImGuiTextBuffer::appendf(buf," Width=%d",(ulong)(uint)(int)pIStack_40->WidthOrWeight);
            }
            if (bVar3) {
              ImGuiTextBuffer::appendf
                        (buf," Visible=%d",(ulong)((byte)pIStack_40->field_0xb >> 2 & 1));
            }
            if (bVar4) {
              ImGuiTextBuffer::appendf(buf," Order=%d",(ulong)(uint)(int)pIStack_40->DisplayOrder);
            }
            if ((bVar5) && (pIStack_40->SortOrder != -1)) {
              local_53 = 'v';
              if ((pIStack_40->field_0xb & 3) != 1) {
                local_53 = '^';
              }
              ImGuiTextBuffer::appendf
                        (buf," Sort=%d%c",(ulong)(uint)(int)pIStack_40->SortOrder,
                         (ulong)(uint)(int)local_53);
            }
            ImGuiTextBuffer::append(buf,"\n",(char *)0x0);
          }
          pIStack_40 = pIStack_40 + 1;
        }
        ImGuiTextBuffer::append(buf,"\n",(char *)0x0);
      }
    }
  }
  return;
}

Assistant:

static void TableSettingsHandler_WriteAll(ImGuiContext* ctx, ImGuiSettingsHandler* handler, ImGuiTextBuffer* buf)
{
    ImGuiContext& g = *ctx;
    for (ImGuiTableSettings* settings = g.SettingsTables.begin(); settings != NULL; settings = g.SettingsTables.next_chunk(settings))
    {
        if (settings->ID == 0) // Skip ditched settings
            continue;

        // TableSaveSettings() may clear some of those flags when we establish that the data can be stripped
        // (e.g. Order was unchanged)
        const bool save_size    = (settings->SaveFlags & ImGuiTableFlags_Resizable) != 0;
        const bool save_visible = (settings->SaveFlags & ImGuiTableFlags_Hideable) != 0;
        const bool save_order   = (settings->SaveFlags & ImGuiTableFlags_Reorderable) != 0;
        const bool save_sort    = (settings->SaveFlags & ImGuiTableFlags_Sortable) != 0;
        if (!save_size && !save_visible && !save_order && !save_sort)
            continue;

        buf->reserve(buf->size() + 30 + settings->ColumnsCount * 50); // ballpark reserve
        buf->appendf("[%s][0x%08X,%d]\n", handler->TypeName, settings->ID, settings->ColumnsCount);
        if (settings->RefScale != 0.0f)
            buf->appendf("RefScale=%g\n", settings->RefScale);
        ImGuiTableColumnSettings* column = settings->GetColumnSettings();
        for (int column_n = 0; column_n < settings->ColumnsCount; column_n++, column++)
        {
            // "Column 0  UserID=0x42AD2D21 Width=100 Visible=1 Order=0 Sort=0v"
            bool save_column = column->UserID != 0 || save_size || save_visible || save_order || (save_sort && column->SortOrder != -1);
            if (!save_column)
                continue;
            buf->appendf("Column %-2d", column_n);
            if (column->UserID != 0)                    buf->appendf(" UserID=%08X", column->UserID);
            if (save_size && column->IsStretch)         buf->appendf(" Weight=%.4f", column->WidthOrWeight);
            if (save_size && !column->IsStretch)        buf->appendf(" Width=%d", (int)column->WidthOrWeight);
            if (save_visible)                           buf->appendf(" Visible=%d", column->IsEnabled);
            if (save_order)                             buf->appendf(" Order=%d", column->DisplayOrder);
            if (save_sort && column->SortOrder != -1)   buf->appendf(" Sort=%d%c", column->SortOrder, (column->SortDirection == ImGuiSortDirection_Ascending) ? 'v' : '^');
            buf->append("\n");
        }
        buf->append("\n");
    }
}